

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall
S2Builder::AddExtraSite
          (S2Builder *this,S2Point *new_site,InputEdgeId max_edge_id,
          MutableS2ShapeIndex *input_edge_index,vector<int,_std::allocator<int>_> *snap_queue)

{
  pointer *ppVVar1;
  iterator __position;
  pointer pcVar2;
  iterator __position_00;
  VType VVar3;
  pointer pRVar4;
  ulong uVar5;
  long lVar6;
  iterator pvVar7;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar8;
  Result *result;
  pointer pRVar9;
  InputEdgeId e;
  vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  results;
  PointTarget target;
  int local_3a0;
  InputEdgeId local_39c;
  vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  local_398;
  ulong local_378;
  MutableS2ShapeIndex *local_370;
  S2Point *local_368;
  Target local_360;
  VType local_358;
  VType VStack_350;
  VType local_348;
  Options local_340;
  S2ClosestEdgeQuery local_328;
  
  __position._M_current =
       (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_378 = (long)__position._M_current -
              (long)(this->sites_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_39c = max_edge_id;
  local_370 = input_edge_index;
  local_368 = new_site;
  if (__position._M_current ==
      (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
    _M_realloc_insert<Vector3<double>const&>
              ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&this->sites_,__position,
               new_site);
  }
  else {
    (__position._M_current)->c_[2] = new_site->c_[2];
    VVar3 = new_site->c_[1];
    (__position._M_current)->c_[0] = new_site->c_[0];
    (__position._M_current)->c_[1] = VVar3;
    ppVVar1 = &(this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_340,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_328,0.0);
  local_340.super_Options.max_error_.length2_._0_6_ =
       local_328.options_.super_Options.max_distance_.super_S1ChordAngle.length2_._0_6_;
  local_340.super_Options.max_error_.length2_._6_2_ =
       local_328.options_.super_Options.max_distance_.super_S1ChordAngle.length2_._6_2_;
  local_340.super_Options.max_results_ = 0x7fffffff;
  local_340.super_Options.include_interiors_ = true;
  local_340.super_Options.use_brute_force_ = false;
  S2ClosestEdgeQuery::Options::set_conservative_max_distance
            (&local_340,(S1ChordAngle)(this->edge_site_query_radius_ca_).length2_);
  local_340.super_Options.include_interiors_ = false;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_328,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_360,0.0);
  local_328.options_.super_Options.max_error_.length2_._0_6_ =
       SUB86(local_360._vptr_S2DistanceTarget,0);
  local_328.options_.super_Options.max_error_.length2_._6_2_ =
       (undefined2)((ulong)local_360._vptr_S2DistanceTarget >> 0x30);
  local_328.options_.super_Options.max_results_ = 0x7fffffff;
  local_328.options_.super_Options.include_interiors_ = true;
  local_328.options_.super_Options.use_brute_force_ = false;
  S2ClosestEdgeQueryBase<S2MinDistance>::S2ClosestEdgeQueryBase(&local_328.base_);
  local_328.options_.super_Options.use_brute_force_ = local_340.super_Options.use_brute_force_;
  local_328.options_.super_Options.include_interiors_ = local_340.super_Options.include_interiors_;
  local_328.options_.super_Options.max_results_ = local_340.super_Options.max_results_;
  local_328.options_.super_Options.max_distance_.super_S1ChordAngle.length2_ =
       local_340.super_Options.max_distance_.super_S1ChordAngle.length2_;
  local_328.options_.super_Options.max_error_.length2_._0_6_ =
       local_340.super_Options.max_error_.length2_._0_6_;
  local_328.options_.super_Options.max_error_.length2_._6_2_ =
       local_340.super_Options.max_error_.length2_._6_2_;
  local_328.base_.index_ = &local_370->super_S2ShapeIndex;
  local_328.base_.index_num_edges_ = 0;
  local_328.base_.index_num_edges_limit_ = 0;
  if (local_328.base_.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_328.base_.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_328.base_.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_328.base_.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  absl::InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
  clear(&local_328.base_.index_cells_);
  local_358 = local_368->c_[0];
  VStack_350 = local_368->c_[1];
  local_348 = local_368->c_[2];
  local_360._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_002c1ad8;
  local_398.
  super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.
  super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.
  super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdges
            (&local_328.base_,&local_360,(Options *)&local_328,&local_398);
  pRVar4 = local_398.
           super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_398.
      super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_398.
      super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar5 = local_378 >> 3;
    pRVar9 = local_398.
             super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_3a0 = pRVar9->edge_id_;
      pcVar2 = (this->edge_sites_).
               super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pcVar2[local_3a0].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false
         ) {
        paVar8 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
                 pcVar2[local_3a0].super_compact_array_base<int,_std::allocator<int>_>.field_7.
                 pointer_;
      }
      else {
        paVar8 = &pcVar2[local_3a0].super_compact_array_base<int,_std::allocator<int>_>.field_7;
      }
      lVar6 = (long)local_3a0;
      pvVar7 = gtl::compact_array_base<int,_std::allocator<int>_>::make_hole
                         (&pcVar2[lVar6].super_compact_array_base<int,_std::allocator<int>_>,
                          (const_iterator)
                          ((long)paVar8 +
                          (ulong)(*(uint *)&pcVar2[local_3a0].
                                            super_compact_array_base<int,_std::allocator<int>_> &
                                 0xffffff) * 4),1);
      *pvVar7 = (int)uVar5 * -0x55555555;
      SortSitesByDistance(this,(this->input_vertices_).
                               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                               (this->input_edges_).
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_3a0].first,
                          (compact_array<int,_std::allocator<int>_> *)
                          &pcVar2[lVar6].super_compact_array_base<int,_std::allocator<int>_>);
      if (local_3a0 <= local_39c) {
        __position_00._M_current =
             (snap_queue->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (snap_queue->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)snap_queue,__position_00,&local_3a0);
        }
        else {
          *__position_00._M_current = local_3a0;
          (snap_queue->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position_00._M_current + 1;
        }
      }
      pRVar9 = pRVar9 + 1;
    } while (pRVar9 != pRVar4);
  }
  if (local_398.
      super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.
                    super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  S2ClosestEdgeQuery::~S2ClosestEdgeQuery(&local_328);
  return;
}

Assistant:

void S2Builder::AddExtraSite(const S2Point& new_site,
                             InputEdgeId max_edge_id,
                             const MutableS2ShapeIndex& input_edge_index,
                             vector<InputEdgeId>* snap_queue) {
  SiteId new_site_id = sites_.size();
  sites_.push_back(new_site);
  // Find all edges whose distance is <= edge_site_query_radius_ca_.
  S2ClosestEdgeQuery::Options options;
  options.set_conservative_max_distance(edge_site_query_radius_ca_);
  options.set_include_interiors(false);
  S2ClosestEdgeQuery query(&input_edge_index, options);
  S2ClosestEdgeQuery::PointTarget target(new_site);
  for (const auto& result : query.FindClosestEdges(&target)) {
    InputEdgeId e = result.edge_id();
    auto* site_ids = &edge_sites_[e];
    site_ids->push_back(new_site_id);
    SortSitesByDistance(input_vertices_[input_edges_[e].first], site_ids);
    if (e <= max_edge_id) snap_queue->push_back(e);
  }
}